

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void handleSelectionClear(XEvent *event)

{
  long in_RDI;
  
  if (*(Atom *)(in_RDI + 0x28) == _glfw.x11.PRIMARY) {
    free(_glfw.x11.primarySelectionString);
    _glfw.x11.primarySelectionString = (char *)0x0;
  }
  else {
    free(_glfw.x11.clipboardString);
    _glfw.x11.clipboardString = (char *)0x0;
  }
  return;
}

Assistant:

static void handleSelectionClear(XEvent* event)
{
    if (event->xselectionclear.selection == _glfw.x11.PRIMARY)
    {
        free(_glfw.x11.primarySelectionString);
        _glfw.x11.primarySelectionString = NULL;
    }
    else
    {
        free(_glfw.x11.clipboardString);
        _glfw.x11.clipboardString = NULL;
    }
}